

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::logProgramInfo
               (NegativeTestContext *ctx,GLint program)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLint maxLength;
  string message;
  vector<char,_std::allocator<char>_> infoLog;
  string programLogMessage;
  GLint local_1fc;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  _Vector_base<char,_std::allocator<char>_> local_1d8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [384];
  
  local_1fc = 0;
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  pTVar2 = (ctx->super_CallLogWrapper).m_log;
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,program,0x8b84,&local_1fc);
  std::__cxx11::string::assign((char *)&local_1f8);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,(string *)&local_1f8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if ((long)local_1fc == 0) {
    std::__cxx11::string::assign((char *)&local_1f8);
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&local_1f8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_1d8,(long)local_1fc,
               (allocator_type *)local_1a0);
    glu::CallLogWrapper::glGetProgramInfoLog
              (&ctx->super_CallLogWrapper,program,local_1fc,&local_1fc,
               local_1d8._M_impl.super__Vector_impl_data._M_start);
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,local_1d8._M_impl.super__Vector_impl_data._M_start,
               local_1d8._M_impl.super__Vector_impl_data._M_start + local_1fc);
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)local_1c0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::~string((string *)local_1c0);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1d8);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  return;
}

Assistant:

void logProgramInfo(NegativeTestContext& ctx, GLint program)
{
	GLint			maxLength	=	0;
	std::string		message;
	tcu::TestLog&	log			=	ctx.getLog();

	ctx.glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

	message = "Program log:";
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	if (maxLength == 0)
	{
		message = "No available info log.";
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		return;
	}

	std::vector<GLchar> infoLog(maxLength);
	ctx.glGetProgramInfoLog(program, maxLength, &maxLength, &infoLog[0]);

	std::string programLogMessage(&infoLog[0], maxLength);
	log << tcu::TestLog::Message << programLogMessage << tcu::TestLog::EndMessage;
}